

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeRecordCompareInt(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  long lVar1;
  int iVar2;
  byte *pbVar3;
  long local_50;
  i64 lhs;
  i64 v;
  u64 x;
  int local_30;
  u32 y;
  int res;
  int serial_type;
  u8 *aKey;
  UnpackedRecord *pPKey2_local;
  void *pKey1_local;
  int nKey1_local;
  
  pbVar3 = (byte *)((long)pKey1 + (ulong)(*pKey1 & 0x3f));
  switch(*(undefined1 *)((long)pKey1 + 1)) {
  case 0:
  case 7:
    iVar2 = sqlite3VdbeRecordCompare(nKey1,pKey1,pPKey2);
    return iVar2;
  case 1:
    local_50 = (long)(char)*pbVar3;
    break;
  case 2:
    local_50 = (long)(int)CONCAT11(*pbVar3,pbVar3[1]);
    break;
  case 3:
    local_50 = (long)(int)((int)(char)*pbVar3 << 0x10 | (uint)pbVar3[1] << 8 | (uint)pbVar3[2]);
    break;
  case 4:
    local_50 = (long)(int)((uint)*pbVar3 << 0x18 | (uint)pbVar3[1] << 0x10 | (uint)pbVar3[2] << 8 |
                          (uint)pbVar3[3]);
    break;
  case 5:
    local_50 = CONCAT44((int)CONCAT11(*pbVar3,pbVar3[1]),
                        (uint)pbVar3[2] << 0x18 | (uint)pbVar3[3] << 0x10 | (uint)pbVar3[4] << 8 |
                        (uint)pbVar3[5]);
    break;
  case 6:
    local_50 = CONCAT44((uint)*pbVar3 << 0x18 | (uint)pbVar3[1] << 0x10 | (uint)pbVar3[2] << 8 |
                        (uint)pbVar3[3],
                        (uint)pbVar3[4] << 0x18 | (uint)pbVar3[5] << 0x10 | (uint)pbVar3[6] << 8 |
                        (uint)pbVar3[7]);
    break;
  case 8:
    local_50 = 0;
    break;
  case 9:
    local_50 = 1;
    break;
  default:
    iVar2 = sqlite3VdbeRecordCompare(nKey1,pKey1,pPKey2);
    return iVar2;
  }
  lVar1 = (pPKey2->aMem->u).i;
  if (local_50 < lVar1) {
    local_30 = (int)pPKey2->r1;
  }
  else if (lVar1 < local_50) {
    local_30 = (int)pPKey2->r2;
  }
  else if (pPKey2->nField < 2) {
    local_30 = (int)pPKey2->default_rc;
    pPKey2->eqSeen = '\x01';
  }
  else {
    local_30 = sqlite3VdbeRecordCompareWithSkip(nKey1,pKey1,pPKey2,1);
  }
  return local_30;
}

Assistant:

static int vdbeRecordCompareInt(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey = &((const u8*)pKey1)[*(const u8*)pKey1 & 0x3F];
  int serial_type = ((const u8*)pKey1)[1];
  int res;
  u32 y;
  u64 x;
  i64 v;
  i64 lhs;

  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  assert( (*(u8*)pKey1)<=0x3F || CORRUPT_DB );
  switch( serial_type ){
    case 1: { /* 1-byte signed integer */
      lhs = ONE_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 2: { /* 2-byte signed integer */
      lhs = TWO_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 3: { /* 3-byte signed integer */
      lhs = THREE_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 4: { /* 4-byte signed integer */
      y = FOUR_BYTE_UINT(aKey);
      lhs = (i64)*(int*)&y;
      testcase( lhs<0 );
      break;
    }
    case 5: { /* 6-byte signed integer */
      lhs = FOUR_BYTE_UINT(aKey+2) + (((i64)1)<<32)*TWO_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 6: { /* 8-byte signed integer */
      x = FOUR_BYTE_UINT(aKey);
      x = (x<<32) | FOUR_BYTE_UINT(aKey+4);
      lhs = *(i64*)&x;
      testcase( lhs<0 );
      break;
    }
    case 8: 
      lhs = 0;
      break;
    case 9:
      lhs = 1;
      break;

    /* This case could be removed without changing the results of running
    ** this code. Including it causes gcc to generate a faster switch 
    ** statement (since the range of switch targets now starts at zero and
    ** is contiguous) but does not cause any duplicate code to be generated
    ** (as gcc is clever enough to combine the two like cases). Other 
    ** compilers might be similar.  */ 
    case 0: case 7:
      return sqlite3VdbeRecordCompare(nKey1, pKey1, pPKey2);

    default:
      return sqlite3VdbeRecordCompare(nKey1, pKey1, pPKey2);
  }

  v = pPKey2->aMem[0].u.i;
  if( v>lhs ){
    res = pPKey2->r1;
  }else if( v<lhs ){
    res = pPKey2->r2;
  }else if( pPKey2->nField>1 ){
    /* The first fields of the two keys are equal. Compare the trailing 
    ** fields.  */
    res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
  }else{
    /* The first fields of the two keys are equal and there are no trailing
    ** fields. Return pPKey2->default_rc in this case. */
    res = pPKey2->default_rc;
    pPKey2->eqSeen = 1;
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res) );
  return res;
}